

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapPerm.c
# Opt level: O1

Vec_Int_t *
Amap_LibDeriveGatePerm_rec(Amap_Lib_t *pLib,Kit_DsdNtk_t *pNtk,int iLit,Amap_Nod_t *pNod)

{
  ushort uVar1;
  ushort uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *p;
  Kit_DsdObj_t *pKVar6;
  long lVar7;
  uint uVar8;
  Amap_Nod_t *pNod_00;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  Kit_DsdObj_t *pKVar12;
  Vec_Int_t *vPerm;
  Vec_Int_t *local_48;
  uint local_3c;
  Vec_Int_t *local_38;
  
  if (-1 < iLit) {
    uVar8 = (uint)iLit >> 1;
    uVar1 = pNtk->nVars;
    if ((uint)pNtk->nNodes + (uint)uVar1 <= uVar8) {
LAB_003ca398:
      __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kit.h"
                    ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
    }
    if (uVar8 < uVar1) {
      pKVar12 = (Kit_DsdObj_t *)0x0;
    }
    else {
      pKVar12 = pNtk->pNodes[(ulong)uVar8 - (ulong)uVar1];
    }
    if (pKVar12 == (Kit_DsdObj_t *)0x0) {
      pVVar3 = (Vec_Int_t *)malloc(0x10);
      pVVar3->nCap = 0x10;
      pVVar3->nSize = 0;
      piVar4 = (int *)malloc(0x40);
      pVVar3->pArray = piVar4;
      local_48 = pVVar3;
      Vec_IntPush(pVVar3,iLit);
      return pVVar3;
    }
    if (((uint)*pKVar12 & 0x1c0) == 0x140) {
      if (pNod->field_0x3 != '\x06') {
        return (Vec_Int_t *)0x0;
      }
      pVVar3 = (Vec_Int_t *)malloc(0x10);
      pVVar3->nCap = 0x10;
      pVVar3->nSize = 0;
      piVar4 = (int *)malloc(0x40);
      pVVar3->pArray = piVar4;
      local_48 = pVVar3;
      if (pNod->iFan0 < 0) goto LAB_003ca3b7;
      pVVar5 = Amap_LibDeriveGatePerm_rec
                         (pLib,pNtk,(uint)*(ushort *)(pKVar12 + 1),
                          (Amap_Nod_t *)
                          (&pLib->pNodes->field_0x0 + (uint)((ushort)pNod->iFan0 >> 1) * 0x18));
      if (pVVar5 != (Vec_Int_t *)0x0) {
        if (0 < pVVar5->nSize) {
          lVar10 = 0;
          do {
            Vec_IntPush(pVVar3,pVVar5->pArray[lVar10]);
            lVar10 = lVar10 + 1;
          } while (lVar10 < pVVar5->nSize);
        }
        if (pVVar5->pArray != (int *)0x0) {
          free(pVVar5->pArray);
          pVVar5->pArray = (int *)0x0;
        }
        free(pVVar5);
        if (pNod->iFan1 < 0) goto LAB_003ca3b7;
        pVVar5 = Amap_LibDeriveGatePerm_rec
                           (pLib,pNtk,(uint)*(ushort *)&pKVar12[1].field_0x2,
                            (Amap_Nod_t *)
                            (&pLib->pNodes->field_0x0 + (uint)((ushort)pNod->iFan1 >> 1) * 0x18));
        if (pVVar5 != (Vec_Int_t *)0x0) {
          if (0 < pVVar5->nSize) {
            lVar10 = 0;
            do {
              Vec_IntPush(pVVar3,pVVar5->pArray[lVar10]);
              lVar10 = lVar10 + 1;
            } while (lVar10 < pVVar5->nSize);
          }
          if (pVVar5->pArray != (int *)0x0) {
            free(pVVar5->pArray);
            pVVar5->pArray = (int *)0x0;
          }
          free(pVVar5);
          if (pNod->iFan2 < 0) goto LAB_003ca3b7;
          pVVar5 = Amap_LibDeriveGatePerm_rec
                             (pLib,pNtk,(uint)*(ushort *)(pKVar12 + 2),
                              (Amap_Nod_t *)
                              (&pLib->pNodes->field_0x0 + (uint)((ushort)pNod->iFan2 >> 1) * 0x18));
          if (pVVar5 != (Vec_Int_t *)0x0) {
            if (0 < pVVar5->nSize) {
              lVar10 = 0;
              do {
                Vec_IntPush(pVVar3,pVVar5->pArray[lVar10]);
                lVar10 = lVar10 + 1;
              } while (lVar10 < pVVar5->nSize);
            }
            if (pVVar5->pArray != (int *)0x0) {
              free(pVVar5->pArray);
              pVVar5->pArray = (int *)0x0;
            }
            free(pVVar5);
            return pVVar3;
          }
        }
      }
      if (pVVar3->pArray != (int *)0x0) {
        free(pVVar3->pArray);
        pVVar3->pArray = (int *)0x0;
      }
    }
    else {
      if (pNod->field_0x3 == '\x06') {
        return (Vec_Int_t *)0x0;
      }
      pVVar3 = Amap_LibCollectFanins(pLib,pNod);
      if (pVVar3->nSize == (uint)*pKVar12 >> 0x1a) {
        pVVar5 = (Vec_Int_t *)malloc(0x10);
        pVVar5->nCap = 0x10;
        pVVar5->nSize = 0;
        piVar4 = (int *)malloc(0x40);
        pVVar5->pArray = piVar4;
        local_48 = pVVar5;
        p = (Vec_Int_t *)malloc(0x10);
        p->nCap = 0x10;
        p->nSize = 0;
        piVar4 = (int *)malloc(0x40);
        p->pArray = piVar4;
        if (0x3ffffff < (uint)*pKVar12) {
          lVar10 = (ulong)((uint)*pKVar12 >> 0x1a) + 1;
          do {
            uVar1 = *(ushort *)((long)&pKVar12->field_0x0 + lVar10 * 2);
            uVar8 = (uint)(uVar1 >> 1);
            uVar2 = pNtk->nVars;
            if ((uint)pNtk->nNodes + (uint)uVar2 <= uVar8) goto LAB_003ca398;
            if (uVar8 < uVar2) {
              pKVar6 = (Kit_DsdObj_t *)0x0;
            }
            else {
              pKVar6 = pNtk->pNodes[(ulong)uVar8 - (ulong)uVar2];
            }
            if (pKVar6 == (Kit_DsdObj_t *)0x0) {
              Vec_IntPush(p,(uint)uVar1);
            }
            else {
              pKVar6->field_0x1 = pKVar6->field_0x1 & 0xfd;
            }
            lVar10 = lVar10 + -1;
          } while (1 < lVar10);
        }
        if (pVVar3->nSize < 1) {
          uVar8 = 0;
        }
        else {
          lVar10 = 0;
          uVar8 = 0;
          local_38 = pVVar3;
          do {
            uVar11 = pVVar3->pArray[lVar10];
            if (uVar11 == 0) {
              if (p->nSize <= (int)uVar8) {
                Vec_IntFree(pVVar5);
                Vec_IntFree(p);
LAB_003ca373:
                Vec_IntFree(pVVar3);
                return (Vec_Int_t *)0x0;
              }
              if ((int)uVar8 < 0) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              uVar9 = (ulong)uVar8;
              uVar8 = uVar8 + 1;
              Vec_IntPush(pVVar5,p->pArray[uVar9]);
            }
            else {
              if ((int)uVar11 < 0) goto LAB_003ca3b7;
              if (0x3ffffff < (uint)*pKVar12) {
                pNod_00 = pLib->pNodes + (uVar11 >> 1);
                uVar1 = pNtk->nVars;
                lVar7 = (ulong)((uint)*pKVar12 >> 0x1a) + 1;
LAB_003ca11e:
                uVar2 = *(ushort *)((long)&pKVar12->field_0x0 + lVar7 * 2);
                uVar11 = (uint)(uVar2 >> 1);
                if (uVar11 < (uint)pNtk->nNodes + (uint)uVar1) {
                  if (uVar11 < uVar1) {
                    pKVar6 = (Kit_DsdObj_t *)0x0;
                  }
                  else {
                    pKVar6 = pNtk->pNodes[(ulong)uVar11 - (ulong)uVar1];
                  }
                  if ((pKVar6 == (Kit_DsdObj_t *)0x0) || (((uint)*pKVar6 >> 9 & 1) != 0))
                  goto LAB_003ca1d4;
                  uVar11 = (uint)*pKVar6 & 0x1c0;
                  if (uVar11 == 0x140) {
                    if (pNod_00->field_0x3 == '\x06') goto LAB_003ca22c;
                    goto LAB_003ca1d4;
                  }
                  if (uVar11 == 0x100) {
                    if (pNod_00->field_0x3 != '\x05') goto LAB_003ca1d4;
                  }
                  else if ((uVar11 != 0xc0) || (pNod_00->field_0x3 != '\x04')) goto LAB_003ca1d4;
LAB_003ca22c:
                  pVVar3 = Amap_LibDeriveGatePerm_rec(pLib,pNtk,uVar2 & 0xfffffffe,pNod_00);
                  if (pVVar3 != (Vec_Int_t *)0x0) {
                    pKVar6->field_0x1 = pKVar6->field_0x1 | 2;
                    local_3c = uVar8;
                    if (0 < pVVar3->nSize) {
                      lVar7 = 0;
                      do {
                        Vec_IntPush(pVVar5,pVVar3->pArray[lVar7]);
                        lVar7 = lVar7 + 1;
                      } while (lVar7 < pVVar3->nSize);
                    }
                    if (pVVar3->pArray != (int *)0x0) {
                      free(pVVar3->pArray);
                      pVVar3->pArray = (int *)0x0;
                    }
                    free(pVVar3);
                    pVVar3 = local_38;
                    uVar8 = local_3c;
                    goto LAB_003ca217;
                  }
                  Vec_IntFree(local_38);
                  Vec_IntFree(p);
                  pVVar3 = pVVar5;
                  goto LAB_003ca373;
                }
                goto LAB_003ca398;
              }
            }
LAB_003ca217:
            lVar10 = lVar10 + 1;
          } while (lVar10 < pVVar3->nSize);
        }
        if (uVar8 != p->nSize) {
          Vec_IntFreeP(&local_48);
        }
        if (pVVar3->pArray != (int *)0x0) {
          free(pVVar3->pArray);
          pVVar3->pArray = (int *)0x0;
        }
        if (pVVar3 != (Vec_Int_t *)0x0) {
          free(pVVar3);
        }
        if (p->pArray != (int *)0x0) {
          free(p->pArray);
          p->pArray = (int *)0x0;
        }
        free(p);
        return local_48;
      }
      if (pVVar3->pArray != (int *)0x0) {
        free(pVVar3->pArray);
        pVVar3->pArray = (int *)0x0;
      }
      if (pVVar3 == (Vec_Int_t *)0x0) {
        return (Vec_Int_t *)0x0;
      }
    }
    free(pVVar3);
    return (Vec_Int_t *)0x0;
  }
LAB_003ca3b7:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf2,"int Abc_Lit2Var(int)");
LAB_003ca1d4:
  lVar7 = lVar7 + -1;
  if (lVar7 < 2) goto LAB_003ca217;
  goto LAB_003ca11e;
}

Assistant:

Vec_Int_t * Amap_LibDeriveGatePerm_rec( Amap_Lib_t * pLib, Kit_DsdNtk_t * pNtk, int iLit, Amap_Nod_t * pNod )
{
    Vec_Int_t * vPerm, * vPermFanin, * vNodFanin, * vDsdLits;
    Kit_DsdObj_t * pDsdObj, * pDsdFanin;
    Amap_Nod_t * pNodFanin;
    int iDsdFanin, iNodFanin, Value, iDsdLit, i, k, j;
//    assert( !Abc_LitIsCompl(iLit) );
    pDsdObj = Kit_DsdNtkObj( pNtk, Abc_Lit2Var(iLit) );
    if ( pDsdObj == NULL )
    {
        vPerm = Vec_IntAlloc( 1 );
        Vec_IntPush( vPerm, iLit );
        return vPerm;
    }
    if ( pDsdObj->Type == KIT_DSD_PRIME && pNod->Type == AMAP_OBJ_MUX )
    {
        vPerm = Vec_IntAlloc( 10 );

        iDsdFanin  = pDsdObj->pFans[0];
        pNodFanin  = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan0) );
        vPermFanin = Amap_LibDeriveGatePerm_rec( pLib, pNtk, iDsdFanin, pNodFanin );
        if ( vPermFanin == NULL )
        {
            Vec_IntFree( vPerm );
            return NULL;
        }
        Vec_IntForEachEntry( vPermFanin, Value, k )
            Vec_IntPush( vPerm, Value );
        Vec_IntFree( vPermFanin );

        iDsdFanin  = pDsdObj->pFans[1];
        pNodFanin  = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan1) );
        vPermFanin = Amap_LibDeriveGatePerm_rec( pLib, pNtk, iDsdFanin, pNodFanin );
        if ( vPermFanin == NULL )
        {
            Vec_IntFree( vPerm );
            return NULL;
        }
        Vec_IntForEachEntry( vPermFanin, Value, k )
            Vec_IntPush( vPerm, Value );
        Vec_IntFree( vPermFanin );

        iDsdFanin  = pDsdObj->pFans[2];
        pNodFanin  = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan2) );
        vPermFanin = Amap_LibDeriveGatePerm_rec( pLib, pNtk, iDsdFanin, pNodFanin );
        if ( vPermFanin == NULL )
        {
            Vec_IntFree( vPerm );
            return NULL;
        }
        Vec_IntForEachEntry( vPermFanin, Value, k )
            Vec_IntPush( vPerm, Value );
        Vec_IntFree( vPermFanin );

        return vPerm;
    }
    // return if wrong types
    if ( pDsdObj->Type == KIT_DSD_PRIME || pNod->Type == AMAP_OBJ_MUX )
        return NULL;
    // return if sizes do not agree
    vNodFanin = Amap_LibCollectFanins( pLib, pNod );
    if ( Vec_IntSize(vNodFanin) != (int)pDsdObj->nFans )
    {
        Vec_IntFree( vNodFanin );
        return NULL;
    }
    // match fanins of DSD with fanins of nodes
    // clean the mark and save variable literals
    vPerm = Vec_IntAlloc( 10 );
    vDsdLits = Vec_IntAlloc( 10 );
    Kit_DsdObjForEachFaninReverse( pNtk, pDsdObj, iDsdFanin, i )
    {
        pDsdFanin = Kit_DsdNtkObj( pNtk, Abc_Lit2Var(iDsdFanin) );
        if ( pDsdFanin )
            pDsdFanin->fMark = 0;
        else
            Vec_IntPush( vDsdLits, iDsdFanin );
    }
    // match each fanins of the node
    iDsdLit = 0;
    Vec_IntForEachEntry( vNodFanin, iNodFanin, k )
    {
        if ( iNodFanin == 0 )
        {
            if ( iDsdLit >= Vec_IntSize(vDsdLits) )
            {
                Vec_IntFree( vPerm );
                Vec_IntFree( vDsdLits );
                Vec_IntFree( vNodFanin );
                return NULL;
            }
            iDsdFanin = Vec_IntEntry( vDsdLits, iDsdLit++ );
            Vec_IntPush( vPerm, iDsdFanin );
            continue;
        }
        // find a matching component
        pNodFanin = Amap_LibNod( pLib, Abc_Lit2Var(iNodFanin) );
        Kit_DsdObjForEachFaninReverse( pNtk, pDsdObj, iDsdFanin, i )
        {
            pDsdFanin = Kit_DsdNtkObj( pNtk, Abc_Lit2Var(iDsdFanin) );
            if ( pDsdFanin == NULL )
                continue;
            if ( pDsdFanin->fMark == 1 )
                continue;
            if ( !((pDsdFanin->Type == KIT_DSD_AND && pNodFanin->Type == AMAP_OBJ_AND) ||
                   (pDsdFanin->Type == KIT_DSD_XOR && pNodFanin->Type == AMAP_OBJ_XOR) ||
                   (pDsdFanin->Type == KIT_DSD_PRIME && pNodFanin->Type == AMAP_OBJ_MUX)) )
                   continue;
            vPermFanin = Amap_LibDeriveGatePerm_rec( pLib, pNtk, Abc_LitRegular(iDsdFanin), pNodFanin );
            if ( vPermFanin == NULL )
            {
                Vec_IntFree( vNodFanin );
                Vec_IntFree( vDsdLits );
                Vec_IntFree( vPerm );
                return NULL;
            }
            pDsdFanin->fMark = 1;
            Vec_IntForEachEntry( vPermFanin, Value, j )
                Vec_IntPush( vPerm, Value );
            Vec_IntFree( vPermFanin );
            break;
        }
    }
//    assert( iDsdLit == Vec_IntSize(vDsdLits) );
    if ( iDsdLit != Vec_IntSize(vDsdLits) )
        Vec_IntFreeP( &vPerm );
    Vec_IntFree( vNodFanin );
    Vec_IntFree( vDsdLits );
    return vPerm;
}